

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Initialize(ImGuiContext *context)

{
  ImU32 IVar1;
  ImGuiViewportP *this;
  ImGuiViewportP *viewport;
  ImGuiViewportP *local_58;
  ImGuiSettingsHandler local_50;
  
  local_50.UserData = (void *)0x0;
  local_50.ReadLineFn =
       (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
  local_50.WriteAllFn =
       (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
  local_50.TypeHash = 0;
  local_50._12_4_ = 0;
  local_50.ReadOpenFn = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
  local_50.TypeName = "Window";
  IVar1 = ImHashStr("Window",0,0);
  local_50.TypeHash = IVar1;
  local_50.ReadOpenFn = WindowSettingsHandler_ReadOpen;
  local_50.ReadLineFn = WindowSettingsHandler_ReadLine;
  local_50.WriteAllFn = WindowSettingsHandler_WriteAll;
  ImVector<ImGuiSettingsHandler>::push_back(&context->SettingsHandlers,&local_50);
  this = (ImGuiViewportP *)MemAlloc(0x110);
  ImGuiViewportP::ImGuiViewportP(this);
  (this->super_ImGuiViewport).ID = 0x11111111;
  *(undefined4 *)&(this->super_ImGuiViewport).field_0x54 = 0;
  this->PlatformWindowCreated = true;
  local_50.TypeName = (char *)this;
  ImVector<ImGuiViewportP_*>::push_back(&context->Viewports,(ImGuiViewportP **)&local_50);
  local_58 = *(context->Viewports).Data;
  (context->PlatformIO).MainViewport = &local_58->super_ImGuiViewport;
  ImVector<ImGuiViewport_*>::push_back(&(context->PlatformIO).Viewports,(ImGuiViewport **)&local_58)
  ;
  DockContextInitialize(context);
  context->Initialized = true;
  return;
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

#ifdef IMGUI_HAS_TABLE
    // Add .ini handle for ImGuiTable type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Table";
        ini_handler.TypeHash = ImHashStr("Table");
        ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
        ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    viewport->ID = IMGUI_VIEWPORT_DEFAULT_ID;
    viewport->Idx = 0;
    viewport->PlatformWindowCreated = true;
    g.Viewports.push_back(viewport);
    g.PlatformIO.MainViewport = g.Viewports[0]; // Make it accessible in public-facing GetPlatformIO() immediately (before the first call to EndFrame)
    g.PlatformIO.Viewports.push_back(g.Viewports[0]);

    // Extensions
    IM_ASSERT(g.DockContext == NULL);
    DockContextInitialize(&g);
#endif // #ifdef IMGUI_HAS_DOCK

    g.Initialized = true;
}